

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# budCovProgram.cpp
# Opt level: O3

cl_program
cov::createProgramWithSource
          (cl_context context,cl_uint count,char **strings,size_t *lengths,cl_int *errcodeRet)

{
  ObjectMagic *pOVar1;
  int iVar2;
  Program *this;
  cl_int cVar3;
  ulong uVar4;
  long lVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  allocator<char> local_79;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  Context *local_60;
  cl_int *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_60 = (Context *)context;
  local_58 = errcodeRet;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_78,(ulong)count,(allocator_type *)local_50);
  if (local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      if (lengths == (size_t *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_50,strings[uVar4],&local_79);
      }
      else {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,strings[uVar4],strings[uVar4] + lengths[uVar4]);
      }
      std::__cxx11::string::operator=
                ((string *)
                 ((long)&((local_78.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5),
                 (string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x20;
    } while (uVar4 < (ulong)((long)local_78.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_78.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  this = (Program *)operator_new(0x38,(nothrow_t *)&std::nothrow);
  if (this == (Program *)0x0) {
    cVar3 = -6;
  }
  else {
    Program::Program(this,local_60,&local_78);
    *(undefined4 *)&this[1].super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)7>.m_icdTable = 1;
    cVar3 = 0;
    if ((this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)7>).m_initSuccess != false)
    goto LAB_0010324b;
    LOCK();
    pOVar1 = &(this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)7>).m_magic;
    *(int *)pOVar1 = *(int *)pOVar1 + -1;
    UNLOCK();
    iVar2._0_1_ = (this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)7>).m_magic;
    iVar2._1_1_ = (this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)7>).m_initSuccess;
    iVar2._2_2_ = *(undefined2 *)
                   &(this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)7>).field_0xa;
    cVar3 = -5;
    if (iVar2 == 0) {
      operator_delete(this,0x10);
    }
  }
  this = (Program *)0x0;
LAB_0010324b:
  *local_58 = cVar3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return (cl_program)this;
}

Assistant:

cl_program createProgramWithSource(cl_context context,
                                   cl_uint count,
                                   const char** strings,
                                   const size_t* lengths,
                                   cl_int* errcodeRet)
{
    auto c = reinterpret_cast<Context*>(context);

    std::vector<std::string> sources(count);
    for (size_t i = 0; i < sources.size(); i++) {
        if (lengths) {
            sources[i] = std::string(strings[i], lengths[i]);
        } else {
            sources[i] = std::string(strings[i]);
        }
    }
    auto program = new(std::nothrow) Countable<Program>(*c, sources);
    if (!program) {
        *errcodeRet = CL_OUT_OF_HOST_MEMORY;
        return nullptr;
    }

    auto p = reinterpret_cast<Program*>(program);
    if (!p->initSuccess()) {
        p->release();
        *errcodeRet = CL_OUT_OF_RESOURCES;
        return nullptr;
    }

    *errcodeRet = CL_SUCCESS;
    return reinterpret_cast<_cl_program*>(p);
}